

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * inputline(void)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *buf;
  char cVar5;
  char *pcVar6;
  
  pcVar4 = ::buf;
  ::buf[0] = '\0';
  while( true ) {
    iVar1 = Getc();
    if (iVar1 == -1) break;
    if (iVar1 == 10) {
      pcVar4[0] = '\n';
      pcVar4[1] = '\0';
      break;
    }
    *pcVar4 = (char)iVar1;
    pcVar4 = pcVar4 + 1;
  }
  sVar2 = strlen(::buf);
  if ((int)sVar2 != 0) {
    ::buf[(int)sVar2 + -1] = '\0';
  }
  buf = ::buf;
  pcVar4 = index(::buf,0x21);
  if (pcVar4 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = pcVar4 + -1;
    *pcVar4 = '\0';
  }
  if ((char *)((long)&endblk + 7) < pcVar6) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)*pcVar6 * 2 + 1) & 0x20) == 0) break;
      *pcVar6 = '\0';
      pcVar6 = pcVar6 + -1;
    } while ((char *)((long)&endblk + 7) < pcVar6);
  }
  cVar5 = ::buf[0];
  if (::buf[0] != '\0') {
    ppuVar3 = __ctype_b_loc();
    buf = ::buf;
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)cVar5 * 2 + 1) & 0x20) == 0) break;
      cVar5 = buf[1];
      buf = buf + 1;
    } while (cVar5 != '\0');
  }
  pcVar4 = stralloc(buf,(char *)0x0);
  return pcVar4;
}

Assistant:

char *inputline()
{
	/* and removes comment, newline, beginning and trailing blanks */
	/* used to get the TITLE line */
	char            *cp;
	int             i;

	buf[0] = '\0';
	cp = Gets(buf);
	i = strlen(buf);
	if (i)
		buf[i - 1] = '\0';
	if ((cp = index(buf, '!')) != (char *) 0) {
		*cp-- = '\0';
	}
	while (cp >= buf && isspace(*cp)) {
		*cp-- = '\0';
	}
	/*EMPTY*/
	for (cp = buf; *cp != '\0' && isspace(*cp); cp++){
		;
	}
	return stralloc(cp, (char *) 0);
}